

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O1

void __thiscall
Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::setSamplesToZero
          (TypedDeepImageChannel<Imath_3_2::half> *this,size_t i,uint oldNumSamples,
          uint newNumSamples)

{
  uint j;
  
  if (oldNumSamples < newNumSamples) {
    memset(this->_sampleListPointers[i] + oldNumSamples,0,
           (ulong)(~oldNumSamples + newNumSamples) * 2 + 2);
    return;
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::setSamplesToZero (
    size_t i, unsigned int oldNumSamples, unsigned int newNumSamples)
{
    //
    // Expand the size of a sample list for a single pixel and
    // set the new samples in the list to 0.
    //
    // i                The position of the affected pixel in
    //                  the channel's _sampleListPointers.
    //
    // oldNumSamples    Original number of samples in the sample list.
    //
    // newNumSamples    New number of samples in the sample list.
    //

    for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
        _sampleListPointers[i][j] = 0;
}